

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O1

void __thiscall
QParallelAnimationGroupPrivate::_q_uncontrolledAnimationFinished
          (QParallelAnimationGroupPrivate *this)

{
  QObject *this_00;
  Span *pSVar1;
  long lVar2;
  QAbstractAnimation **ppQVar3;
  int iVar4;
  int iVar5;
  QObject *pQVar6;
  Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> *pDVar7;
  ulong uVar8;
  Data *pDVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  
  this_00 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
            super_QObjectPrivate.super_QObjectData.q_ptr;
  pQVar6 = QObject::sender(this_00);
  pQVar6 = QMetaObject::cast(&QAbstractAnimation::staticMetaObject,pQVar6);
  iVar4 = (*pQVar6->_vptr_QObject[0xc])(pQVar6);
  if ((iVar4 != -1) &&
     (iVar4 = QAbstractAnimation::loopCount((QAbstractAnimation *)pQVar6), -1 < iVar4))
  goto LAB_003b427b;
  pDVar7 = (this->uncontrolledFinishTime).d;
  if (pDVar7 == (Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_> *)0x0) {
    pDVar9 = (Data *)0x0;
LAB_003b4196:
    uVar10 = 0;
  }
  else {
    if (1 < (uint)(pDVar7->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      pDVar7 = QHashPrivate::Data<QHashPrivate::Node<QAbstractAnimation_*,_int>_>::detached(pDVar7);
      (this->uncontrolledFinishTime).d = pDVar7;
    }
    pDVar9 = (this->uncontrolledFinishTime).d;
    if (pDVar9->spans->offsets[0] != 0xff) goto LAB_003b4196;
    uVar8 = 1;
    do {
      uVar10 = uVar8;
      if (pDVar9->numBuckets == uVar10) {
        pDVar9 = (Data *)0x0;
        uVar10 = 0;
        break;
      }
      uVar8 = uVar10 + 1;
    } while (pDVar9->spans[uVar10 >> 7].offsets[(uint)uVar10 & 0x7f] == 0xff);
  }
  if (uVar10 != 0 || pDVar9 != (Data *)0x0) {
    iVar4 = 0;
    do {
      uVar8 = uVar10 >> 7;
      uVar11 = (uint)uVar10 & 0x7f;
      if (*(QObject **)
           pDVar9->spans[uVar8].entries[pDVar9->spans[uVar8].offsets[uVar11]].storage.data == pQVar6
         ) {
        iVar5 = QAbstractAnimation::currentTime((QAbstractAnimation *)pQVar6);
        *(int *)(pDVar9->spans[uVar8].entries[pDVar9->spans[uVar8].offsets[uVar11]].storage.data + 8
                ) = iVar5;
      }
      pSVar1 = pDVar9->spans;
      iVar4 = iVar4 + (uint)(*(int *)(pSVar1[uVar8].entries[pSVar1[uVar8].offsets[uVar11]].storage.
                                      data + 8) == -1);
      do {
        if (pDVar9->numBuckets - 1 == uVar10) {
          uVar10 = 0;
          pDVar9 = (Data *)0x0;
          break;
        }
        uVar10 = uVar10 + 1;
      } while (pSVar1[uVar10 >> 7].offsets[(uint)uVar10 & 0x7f] == 0xff);
    } while ((uVar10 != 0) || (pDVar9 != (Data *)0x0));
    if (iVar4 != 0) {
      return;
    }
  }
LAB_003b427b:
  lVar2 = (this->super_QAnimationGroupPrivate).animations.d.size;
  if (lVar2 == 0) {
    iVar4 = 0;
  }
  else {
    ppQVar3 = (this->super_QAnimationGroupPrivate).animations.d.ptr;
    lVar12 = 0;
    iVar4 = 0;
    do {
      iVar5 = QAbstractAnimation::totalDuration(*(QAbstractAnimation **)((long)ppQVar3 + lVar12));
      if (iVar5 < iVar4) {
        iVar5 = iVar4;
      }
      iVar4 = iVar5;
      lVar12 = lVar12 + 8;
    } while (lVar2 << 3 != lVar12);
  }
  if ((this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime < iVar4) {
    return;
  }
  QAbstractAnimation::stop((QAbstractAnimation *)this_00);
  return;
}

Assistant:

void QParallelAnimationGroupPrivate::_q_uncontrolledAnimationFinished()
{
    Q_Q(QParallelAnimationGroup);

    QAbstractAnimation *animation = qobject_cast<QAbstractAnimation *>(q->sender());
    Q_ASSERT(animation);

    int uncontrolledRunningCount = 0;
    if (animation->duration() == -1 || animation->loopCount() < 0) {
        for (AnimationTimeHashIt it = uncontrolledFinishTime.begin(), cend = uncontrolledFinishTime.end(); it != cend; ++it) {
            if (it.key() == animation) {
                *it = animation->currentTime();
            }
            if (it.value() == -1)
                ++uncontrolledRunningCount;
        }
    }

    if (uncontrolledRunningCount > 0)
        return;

    int maxDuration = 0;
    for (AnimationListConstIt it = animations.constBegin(), cend = animations.constEnd(); it != cend; ++it)
        maxDuration = qMax(maxDuration, (*it)->totalDuration());

    if (currentTime >= maxDuration)
        q->stop();
}